

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::UpdateByCustom(cmCTestGIT *this,string *custom)

{
  bool bVar1;
  size_type sVar2;
  char **cmd;
  string_view arg;
  undefined1 local_118 [8];
  OutputLogger custom_err;
  OutputLogger custom_out;
  value_type local_90;
  reference local_88;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_58 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> git_custom;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_custom_command;
  string *custom_local;
  cmCTestGIT *this_local;
  
  git_custom_command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = custom;
  arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)custom);
  git_custom.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arg._M_len;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30,arg,true);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,sVar2 + 1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_30);
  i = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar1) break;
    local_88 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_90 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,&local_90);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  custom_out.super_LineParser.Separator = '\0';
  custom_out.super_LineParser.LineEnd = '\0';
  custom_out.super_LineParser.IgnoreCR = false;
  custom_out.super_LineParser._59_5_ = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,
             (value_type *)&custom_out.super_LineParser.Separator);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&custom_err.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"custom-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_118,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "custom-err> ");
  cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  bVar1 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,cmd,(OutputParser *)&custom_err.super_LineParser.Separator,
                     (OutputParser *)local_118,Auto);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_118);
  cmProcessTools::OutputLogger::~OutputLogger
            ((OutputLogger *)&custom_err.super_LineParser.Separator);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return bVar1;
}

Assistant:

bool cmCTestGIT::UpdateByCustom(std::string const& custom)
{
  std::vector<std::string> git_custom_command = cmExpandedList(custom, true);
  std::vector<char const*> git_custom;
  git_custom.reserve(git_custom_command.size() + 1);
  for (std::string const& i : git_custom_command) {
    git_custom.push_back(i.c_str());
  }
  git_custom.push_back(nullptr);

  OutputLogger custom_out(this->Log, "custom-out> ");
  OutputLogger custom_err(this->Log, "custom-err> ");
  return this->RunUpdateCommand(git_custom.data(), &custom_out, &custom_err);
}